

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void nga_sprs_array_col_block_list_(Integer *s_a,Integer *idx,Integer *n)

{
  Integer **in_RDX;
  Integer in_RSI;
  int i;
  Integer *blocks;
  Integer nn;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  undefined4 local_2c;
  undefined8 local_28;
  Integer *in_stack_ffffffffffffffe0;
  
  pnga_sprs_array_col_block_list(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  if ((long)*in_RDX < (long)in_stack_ffffffffffffffe0) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  else {
    for (local_2c = 0; (long)local_2c < (long)in_stack_ffffffffffffffe0; local_2c = local_2c + 1) {
      *(undefined8 *)(in_RSI + (long)local_2c * 8) =
           *(undefined8 *)((long)local_28 + (long)local_2c * 8);
    }
    free(local_28);
    *in_RDX = in_stack_ffffffffffffffe0;
  }
  return;
}

Assistant:

void nga_sprs_array_col_block_list_(Integer *s_a, Integer *idx, Integer *n)
{
  /* This function assumes that idx has already been allocated by calling
   * program and that nn is the length of idx on input. On output, nn is
   * changed to the actual number of blocks found by the
   * wnga_sprs_array_col_block_list function
   */
  Integer nn;
  Integer *blocks;
  wnga_sprs_array_col_block_list(*s_a, &blocks, &nn);
  if (*n < nn) {
    wnga_error("nga_sprs_array_col_block_list: allocated array is too small for"
        " number of blocks found: ",nn);
  } else {
    int i;
    for (i=0; i<nn; i++) idx[i] = blocks[i];
    free(blocks);
    *n = nn;
  }
}